

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplesUtil.cpp
# Opt level: O3

RecordingData *
aeron::archive::getLatestRecordingData
          (RecordingData *__return_storage_ptr__,AeronArchive *archive,string *channel,
          int32_t streamId)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  __return_storage_ptr__->recordingId = -1;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(long,_long,_long,_long,_long,_long,_long,_int,_int,_int,_int,_int,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/samples/SamplesUtil.cpp:29:21)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(long,_long,_long,_long,_long,_long,_long,_int,_int,_int,_int,_int,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/samples/SamplesUtil.cpp:29:21)>
             ::_M_manager;
  local_28._M_unused._M_object = __return_storage_ptr__;
  AeronArchive::listRecordingsForUri
            (archive,0,100,channel,streamId,(RecordingDescriptorConsumer *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

RecordingData getLatestRecordingData(aeron::archive::AeronArchive& archive, const std::string& channel,
                                     std::int32_t streamId) {
    RecordingData result;
    result.recordingId = -1;

    auto consumer = [&](long controlSessionId, long correlationId, long recordingId, long startTimestamp,
                        long stopTimestamp, long startPosition, long stopPosition, int initialTermId,
                        int segmentFileLength, int termBufferLength, int mtuLength, int sessionId, int streamId,
                        const std::string& strippedChannel, const std::string& originalChannel,
                        const std::string& sourceIdentity) {
        result.recordingId = recordingId;
        result.stopPosition = stopPosition;
        result.initialTermId = initialTermId;
        result.termBufferLength = termBufferLength;
    };

    archive.listRecordingsForUri(0, 100, channel, streamId, consumer);
    return result;
}